

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O0

Vec_Wec_t * Gia_ManCheckUnateVec(Gia_Man_t *p,Vec_Int_t *vCiIds,Vec_Int_t *vCoIds)

{
  int iVar1;
  int i_00;
  Vec_Wec_t *p_00;
  Vec_Wec_t *p_01;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *pVVar2;
  bool bVar3;
  Vec_Int_t *local_e8;
  Vec_Int_t *local_b0;
  Vec_Int_t *local_a8;
  Vec_Int_t *local_70;
  Vec_Int_t *local_68;
  int local_5c;
  int CioId;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vUnate1;
  Vec_Int_t *vUnate0;
  Vec_Wec_t *vUnates;
  Vec_Wec_t *vUnatesCo;
  Vec_Int_t *vCoVec;
  Vec_Int_t *vCiVec;
  Vec_Int_t *vCoIds_local;
  Vec_Int_t *vCiIds_local;
  Gia_Man_t *p_local;
  
  if (vCiIds == (Vec_Int_t *)0x0) {
    iVar1 = Gia_ManCiNum(p);
    local_68 = Vec_IntStartNatural(iVar1);
  }
  else {
    local_68 = Vec_IntDup(vCiIds);
  }
  if (vCoIds == (Vec_Int_t *)0x0) {
    iVar1 = Gia_ManCoNum(p);
    local_70 = Vec_IntStartNatural(iVar1);
  }
  else {
    local_70 = Vec_IntDup(vCoIds);
  }
  iVar1 = Vec_IntSize(local_70);
  p_00 = Vec_WecStart(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_WecStart(iVar1);
  for (local_5c = 0; iVar1 = Vec_IntSize(local_68), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(local_68,local_5c);
    _CioId = Gia_ManCi(p,iVar1);
    i_00 = Gia_ObjId(p,_CioId);
    pVVar2 = Vec_WecEntry(p_01,i_00);
    iVar1 = Abc_Var2Lit(iVar1,0);
    Vec_IntPush(pVVar2,iVar1);
  }
  local_5c = 0;
  while( true ) {
    bVar3 = false;
    if (local_5c < p->nObjs) {
      _CioId = Gia_ManObj(p,local_5c);
      bVar3 = _CioId != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd(_CioId);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(_CioId,local_5c);
      local_a8 = Vec_WecEntry(p_01,iVar1);
      iVar1 = Gia_ObjFaninId1(_CioId,local_5c);
      local_b0 = Vec_WecEntry(p_01,iVar1);
      iVar1 = Gia_ObjFaninC0(_CioId);
      if (iVar1 != 0) {
        local_a8 = Vec_IntFlopBit(local_a8);
      }
      iVar1 = Gia_ObjFaninC1(_CioId);
      if (iVar1 != 0) {
        local_b0 = Vec_IntFlopBit(local_b0);
      }
      pVVar2 = Vec_WecEntry(p_01,local_5c);
      Vec_IntTwoMerge2(local_a8,local_b0,pVVar2);
      iVar1 = Gia_ObjFaninC0(_CioId);
      if (iVar1 != 0) {
        Vec_IntFlopBit(local_a8);
      }
      iVar1 = Gia_ObjFaninC1(_CioId);
      if (iVar1 != 0) {
        Vec_IntFlopBit(local_b0);
      }
    }
    local_5c = local_5c + 1;
  }
  for (local_5c = 0; iVar1 = Vec_IntSize(local_70), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(local_70,local_5c);
    pObj_00 = Gia_ManCo(p,iVar1);
    iVar1 = Gia_ObjFaninId0p(p,pObj_00);
    local_e8 = Vec_WecEntry(p_01,iVar1);
    iVar1 = Gia_ObjFaninC0(pObj_00);
    if (iVar1 != 0) {
      local_e8 = Vec_IntFlopBit(local_e8);
    }
    pVVar2 = Vec_WecEntry(p_00,local_5c);
    Vec_IntAppend(pVVar2,local_e8);
    iVar1 = Gia_ObjFaninC0(pObj_00);
    if (iVar1 != 0) {
      Vec_IntFlopBit(local_e8);
    }
  }
  Vec_WecFree(p_01);
  Vec_IntFree(local_68);
  Vec_IntFree(local_70);
  return p_00;
}

Assistant:

Vec_Wec_t * Gia_ManCheckUnateVec( Gia_Man_t * p, Vec_Int_t * vCiIds, Vec_Int_t * vCoIds )
{
    Vec_Int_t * vCiVec = vCiIds ? Vec_IntDup(vCiIds) : Vec_IntStartNatural(Gia_ManCiNum(p));
    Vec_Int_t * vCoVec = vCoIds ? Vec_IntDup(vCoIds) : Vec_IntStartNatural(Gia_ManCoNum(p));
    Vec_Wec_t * vUnatesCo = Vec_WecStart( Vec_IntSize(vCoVec) );
    Vec_Wec_t * vUnates   = Vec_WecStart( Gia_ManObjNum(p) );
    Vec_Int_t * vUnate0, * vUnate1;
    Gia_Obj_t * pObj; int i, CioId;
    Vec_IntForEachEntry( vCiVec, CioId, i )
    {
        pObj = Gia_ManCi( p, CioId );
        Vec_IntPush( Vec_WecEntry(vUnates, Gia_ObjId(p, pObj)), Abc_Var2Lit(CioId, 0) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        vUnate0 = Vec_WecEntry(vUnates, Gia_ObjFaninId0(pObj, i));
        vUnate1 = Vec_WecEntry(vUnates, Gia_ObjFaninId1(pObj, i));
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        vUnate1 = Gia_ObjFaninC1(pObj) ? Vec_IntFlopBit(vUnate1) : vUnate1;
        Vec_IntTwoMerge2( vUnate0, vUnate1, Vec_WecEntry(vUnates, i) ); 
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        vUnate1 = Gia_ObjFaninC1(pObj) ? Vec_IntFlopBit(vUnate1) : vUnate1;
    }
    Vec_IntForEachEntry( vCoVec, CioId, i )
    {
        pObj    = Gia_ManCo( p, CioId );
        vUnate0 = Vec_WecEntry(vUnates, Gia_ObjFaninId0p(p, pObj));
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        Vec_IntAppend( Vec_WecEntry(vUnatesCo, i), vUnate0 );
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
    }
    Vec_WecFree( vUnates );
    Vec_IntFree( vCiVec );
    Vec_IntFree( vCoVec );
    return vUnatesCo;
}